

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void LinearSmoothing(double *input,double width,int fs,int fft_size,double *output)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int boundary_00;
  ulong uVar6;
  double *mirroring_spectrum_00;
  double *mirroring_segment_00;
  double *frequency_axis_00;
  double *yi;
  double *yi_00;
  double x;
  int local_70;
  int local_6c;
  int i_1;
  int i;
  double discrete_frequency_interval;
  double origin_of_mirroring_axis;
  double *high_levels;
  double *low_levels;
  double *frequency_axis;
  double *mirroring_segment;
  double *mirroring_spectrum;
  int boundary;
  double *output_local;
  int fft_size_local;
  int fs_local;
  double width_local;
  double *input_local;
  
  boundary_00 = (int)((width * (double)fft_size) / (double)fs) + 1;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(fft_size / 2 + boundary_00 * 2 + 1);
  uVar6 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  mirroring_spectrum_00 = (double *)operator_new__(uVar6);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(fft_size / 2 + boundary_00 * 2 + 1);
  uVar6 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  mirroring_segment_00 = (double *)operator_new__(uVar6);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)(fft_size / 2 + 1);
  uVar6 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  frequency_axis_00 = (double *)operator_new__(uVar6);
  anon_unknown.dwarf_5018::SetParametersForLinearSmoothing
            (boundary_00,fft_size,fs,width,input,mirroring_spectrum_00,mirroring_segment_00,
             frequency_axis_00);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)(fft_size / 2 + 1);
  uVar6 = SUB168(auVar4 * ZEXT816(8),0);
  if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  yi = (double *)operator_new__(uVar6);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (long)(fft_size / 2 + 1);
  uVar6 = SUB168(auVar5 * ZEXT816(8),0);
  if (SUB168(auVar5 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  yi_00 = (double *)operator_new__(uVar6);
  x = (-((double)boundary_00 - 0.5) * (double)fs) / (double)fft_size;
  interp1Q(x,(double)fs / (double)fft_size,mirroring_segment_00,fft_size / 2 + boundary_00 * 2 + 1,
           frequency_axis_00,fft_size / 2 + 1,yi);
  for (local_6c = 0; local_6c <= fft_size / 2; local_6c = local_6c + 1) {
    frequency_axis_00[local_6c] = width + frequency_axis_00[local_6c];
  }
  interp1Q(x,(double)fs / (double)fft_size,mirroring_segment_00,fft_size / 2 + boundary_00 * 2 + 1,
           frequency_axis_00,fft_size / 2 + 1,yi_00);
  for (local_70 = 0; local_70 <= fft_size / 2; local_70 = local_70 + 1) {
    output[local_70] = (yi_00[local_70] - yi[local_70]) / width;
  }
  if (mirroring_spectrum_00 != (double *)0x0) {
    operator_delete__(mirroring_spectrum_00);
  }
  if (mirroring_segment_00 != (double *)0x0) {
    operator_delete__(mirroring_segment_00);
  }
  if (frequency_axis_00 != (double *)0x0) {
    operator_delete__(frequency_axis_00);
  }
  if (yi != (double *)0x0) {
    operator_delete__(yi);
  }
  if (yi_00 != (double *)0x0) {
    operator_delete__(yi_00);
  }
  return;
}

Assistant:

void LinearSmoothing(const double *input, double width, int fs, int fft_size,
    double *output) {
  int boundary = static_cast<int>(width * fft_size / fs) + 1;

  // These parameters are set by the other function.
  double *mirroring_spectrum = new double[fft_size / 2 + boundary * 2 + 1];
  double *mirroring_segment = new double[fft_size / 2 + boundary * 2 + 1];
  double *frequency_axis = new double[fft_size / 2 + 1];
  SetParametersForLinearSmoothing(boundary, fft_size, fs, width,
      input, mirroring_spectrum, mirroring_segment, frequency_axis);

  double *low_levels = new double[fft_size / 2 + 1];
  double *high_levels = new double[fft_size / 2 + 1];
  double origin_of_mirroring_axis = -(boundary - 0.5) * fs / fft_size;
  double discrete_frequency_interval = static_cast<double>(fs) / fft_size;

  interp1Q(origin_of_mirroring_axis, discrete_frequency_interval,
      mirroring_segment, fft_size / 2 + boundary * 2 + 1, frequency_axis,
      fft_size / 2 + 1, low_levels);

  for (int i = 0; i <= fft_size / 2; ++i) frequency_axis[i] += width;

  interp1Q(origin_of_mirroring_axis, discrete_frequency_interval,
      mirroring_segment, fft_size / 2 + boundary * 2 + 1, frequency_axis,
      fft_size / 2 + 1, high_levels);

  for (int i = 0; i <= fft_size / 2; ++i)
    output[i] = (high_levels[i] - low_levels[i]) / width;

  delete[] mirroring_spectrum;
  delete[] mirroring_segment;
  delete[] frequency_axis;
  delete[] low_levels;
  delete[] high_levels;
}